

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference ppTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *paVar5;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *this_01;
  reference ppTVar6;
  int in_ESI;
  long in_RDI;
  string *in_stack_00000038;
  string *in_stack_00000040;
  bool is_selected;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  string *test_case_name;
  TestCase *test_case;
  size_t i;
  int num_selected_tests;
  int num_runnable_tests;
  Int32 shard_index;
  Int32 total_shards;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  value_type in_stack_fffffffffffffef8;
  bool local_ff;
  bool local_fe;
  bool local_fd;
  bool local_fa;
  allocator<char> *in_stack_ffffffffffffff20;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  Int32 default_val;
  char *in_stack_ffffffffffffff38;
  Int32 local_b8;
  Int32 local_b4;
  allocator<char> local_a1;
  string local_a0 [32];
  value_type local_80;
  allocator<char> *local_78;
  allocator<char> local_59;
  string local_58 [32];
  string *local_38;
  value_type local_30;
  ulong local_28;
  int local_1c;
  int local_18;
  Int32 local_14;
  Int32 local_10;
  int local_c;
  
  default_val = (Int32)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_c = in_ESI;
  if (in_ESI == 0) {
    local_b4 = Int32FromEnvOrDie(in_stack_ffffffffffffff38,default_val);
  }
  else {
    local_b4 = -1;
  }
  local_10 = local_b4;
  if (local_c == 0) {
    local_b8 = Int32FromEnvOrDie(in_stack_ffffffffffffff38,default_val);
  }
  else {
    local_b8 = -1;
  }
  local_14 = local_b8;
  local_18 = 0;
  local_1c = 0;
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                       (in_RDI + 0xb8));
    if (sVar3 <= uVar1) break;
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                         (in_RDI + 0xb8),local_28);
    local_30 = *ppTVar4;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              TestCase::name((TestCase *)0x6533a3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<char>::~allocator(&local_59);
    local_38 = local_58;
    TestCase::set_should_run(local_30,false);
    local_78 = (allocator<char> *)0x0;
    while( true ) {
      in_stack_ffffffffffffff20 = local_78;
      in_stack_ffffffffffffff28 = TestCase::test_info_list(local_30);
      paVar5 = (allocator<char> *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size
                         (in_stack_ffffffffffffff28);
      if (paVar5 <= in_stack_ffffffffffffff20) break;
      this_01 = TestCase::test_info_list(local_30);
      ppTVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (this_01,(size_type)local_78);
      local_80 = *ppTVar6;
      TestInfo::name((TestInfo *)0x653487);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::allocator<char>::~allocator(&local_a1);
      bVar2 = UnitTestOptions::MatchesFilter
                        ((string *)in_stack_fffffffffffffef8,
                         (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      local_fa = true;
      if (!bVar2) {
        local_fa = UnitTestOptions::MatchesFilter
                             ((string *)in_stack_fffffffffffffef8,
                              (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0))
        ;
      }
      local_80->is_disabled_ = local_fa;
      bVar2 = UnitTestOptions::FilterMatchesTest(in_stack_00000040,in_stack_00000038);
      local_80->matches_filter_ = bVar2;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) || (local_fd = false, local_fa == false))
      {
        local_fd = bVar2;
      }
      local_fe = false;
      if (local_fd != false) {
        local_ff = true;
        if (local_c != 1) {
          local_ff = ShouldRunTestOnShard(local_10,local_14,local_18);
        }
        local_fe = local_ff;
      }
      local_18 = local_18 + (uint)local_fd;
      local_1c = local_1c + (uint)local_fe;
      local_80->should_run_ = local_fe;
      in_stack_fffffffffffffef8 = local_30;
      bVar2 = TestCase::should_run(local_30);
      in_stack_fffffffffffffef7 = true;
      if (!bVar2) {
        in_stack_fffffffffffffef7 = local_fe;
      }
      TestCase::set_should_run(in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7);
      std::__cxx11::string::~string(local_a0);
      local_78 = local_78 + 1;
    }
    std::__cxx11::string::~string(local_58);
    local_28 = local_28 + 1;
  }
  return local_1c;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const std::string &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_selected = is_runnable &&
          (shard_tests == IGNORE_SHARDING_PROTOCOL ||
           ShouldRunTestOnShard(total_shards, shard_index,
                                num_runnable_tests));

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}